

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharable.cc
# Opt level: O0

void __thiscall xemmai::t_sharable::f_share(t_sharable *this)

{
  long *in_FS_OFFSET;
  wstring_view a_message;
  t_lock_with_safe_region<std::shared_mutex> local_28;
  t_lock_with_safe_region<std::shared_mutex> lock;
  t_sharable *this_local;
  
  if ((this->super_t_owned).v_owner != *(t_queue<128UL> **)(*in_FS_OFFSET + -0x68)) {
    _lock = sv(L"not owned.",10);
    a_message._M_str = lock._8_8_;
    a_message._M_len = (size_t)a_message._M_str;
    f_throw((xemmai *)lock.super_lock_guard<std::shared_mutex>._M_device,a_message);
  }
  t_lock_with_safe_region<std::shared_mutex>::t_lock_with_safe_region(&local_28,&this->v_mutex);
  (this->super_t_owned).v_owner = (t_queue<128UL> *)0x0;
  t_lock_with_safe_region<std::shared_mutex>::~t_lock_with_safe_region(&local_28);
  return;
}

Assistant:

void t_sharable::f_share()
{
	if (v_owner != t_slot::t_increments::v_instance) f_throw(L"not owned."sv);
	t_lock_with_safe_region lock(v_mutex);
	v_owner = nullptr;
}